

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EraseKey<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
::TestBody(EraseKey<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
           *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<int,_std::allocator<int>_>_> bVar2;
  char *pcVar3;
  reference pvVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  vector<int,_std::allocator<int>_> *container;
  UnorderedElementsAreArrayMatcher<int> *matcher;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *s;
  UnorderedElementsAreArrayMatcher<int> *matcher_00;
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  *s_00;
  AssertHelper local_248;
  Message local_240;
  vector<int,_std::allocator<int>_> local_238;
  int *local_220;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_218;
  testing *local_210;
  UnorderedElementsAreArrayMatcher<int> local_208;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_1e8
  ;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_3;
  Message local_1b0;
  iterator local_1a8;
  iterator local_198;
  difference_type local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  Message local_160;
  size_type local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_130;
  Message local_128;
  vector<int,_std::allocator<int>_> local_120;
  UnorderedElementsAreArrayMatcher<int> local_108;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_> local_e8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_b0;
  StatefulTestingHash local_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  undefined1 local_90 [8];
  TypeParam m;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  EraseKey<phmap::node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>_>
  *this_local;
  
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  bVar2 = std::back_inserter<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)local_28);
  m.
  super_raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       generate_n<std::back_insert_iterator<std::vector<int,std::allocator<int>>>,int,phmap::priv::hash_internal::Generator<int,void>>
                 (bVar2.container,10);
  local_98._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_28);
  local_a0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_28);
  local_a8.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_a8);
  local_b0.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_b0);
  Alloc<int>::Alloc((Alloc<int> *)&gtest_ar.message_,0);
  node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::raw_hash_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)local_90,local_98,local_a0,0,&local_a8,&local_b0,
             (allocator_type *)&gtest_ar.message_);
  Alloc<int>::~Alloc((Alloc<int> *)&gtest_ar.message_);
  testing::UnorderedElementsAreArray<std::vector<int,std::allocator<int>>>
            (&local_108,(testing *)local_28,container);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
            (&local_e8,(internal *)&local_108,matcher);
  keys<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
            (&local_120,(priv *)local_90,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
  operator()(local_c8,(char *)&local_e8,(vector<int,_std::allocator<int>_> *)"keys(m)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_120);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
  ~PredicateFormatterFromMatcher(&local_e8);
  testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
            (&local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_14c = 1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,0);
    local_158 = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                ::erase<int>((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                              *)local_90,pvVar4);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_148,"1","m.erase(values[0])",&local_14c,&local_158);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
                 ,0x9d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_160);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_160);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
    local_17c = 0;
    local_198 = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                ::begin((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                         *)local_90);
    local_1a8 = raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                ::end((raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                       *)local_90);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,0);
    local_188 = std::
                count<phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>::iterator,int>
                          (local_198,local_1a8,pvVar4);
    last._M_current = &local_17c;
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_178,"0","std::count(m.begin(), m.end(), values[0])",last._M_current
               ,&local_188);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
      last._M_current = (int *)0x9e;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
                 ,0x9e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    local_218._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_28);
    local_210 = (testing *)
                __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&local_218,1);
    local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)local_28);
    testing::
    UnorderedElementsAreArray<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&local_208,local_210,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_220,last);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>
              (&local_1e8,(internal *)&local_208,matcher_00);
    keys<phmap::node_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>>
              (&local_238,(priv *)local_90,s_00);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>>::
    operator()(local_1c8,(char *)&local_1e8,(vector<int,_std::allocator<int>_> *)"keys(m)");
    std::vector<int,_std::allocator<int>_>::~vector(&local_238);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<int>_>::
    ~PredicateFormatterFromMatcher(&local_1e8);
    testing::internal::UnorderedElementsAreArrayMatcher<int>::~UnorderedElementsAreArrayMatcher
              (&local_208);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_modifiers_test.h"
                 ,0xa0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message(&local_240);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::~node_hash_set((node_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                    *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EraseKey) {
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m(values.begin(), values.end());
  ASSERT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
  EXPECT_EQ(1, m.erase(values[0]));
  EXPECT_EQ(0, std::count(m.begin(), m.end(), values[0]));
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values.begin() + 1,
                                                            values.end()));
}